

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i)

{
  ulong uVar1;
  real *prVar2;
  real *prVar3;
  uint __line;
  ulong uVar4;
  char *__assertion;
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x31;
  }
  else if (i < A->m_) {
    uVar1 = this->m_;
    if (uVar1 == A->n_) {
      prVar2 = A->data_;
      prVar3 = this->data_;
      for (uVar4 = 0; (~((long)uVar1 >> 0x3f) & uVar1) != uVar4; uVar4 = uVar4 + 1) {
        prVar3[uVar4] = prVar2[i * uVar1 + uVar4] + prVar3[uVar4];
      }
      return;
    }
    __assertion = "m_ == A.n_";
    __line = 0x33;
  }
  else {
    __assertion = "i < A.m_";
    __line = 0x32;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                ,__line,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i) {
  //std::cout << A.m_ << std::endl;
  //std::cout << A.n_ << std::endl;
  assert(i >= 0);
  assert(i < A.m_);
  assert(m_ == A.n_);
  for (int64_t j = 0; j < A.n_; j++) {
    data_[j] += A.data_[i * A.n_ + j];
  }
}